

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

bool __thiscall
HighsDomain::ConflictSet::explainBoundChangeConflict
          (ConflictSet *this,LocalDomChg *locdomchg,HighsDomainChange *conflict,HighsInt len)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  double *pdVar4;
  reference pvVar5;
  int in_ECX;
  long in_RDX;
  HighsDomainChange *in_RDI;
  double dVar6;
  HighsDomainChange HVar7;
  double ub;
  double lb;
  HighsInt pos;
  HighsInt i;
  bool foundDomchg;
  HighsDomainChange domchg;
  value_type *in_stack_ffffffffffffff78;
  HighsInt *this_00;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  HighsDomainChange *in_stack_ffffffffffffff98;
  HighsInt col;
  HighsDomain *in_stack_ffffffffffffffa0;
  int local_44;
  int local_40;
  double local_38;
  int local_30;
  HighsBoundType HStack_2c;
  
  std::
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  ::clear((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
           *)0x5d0000);
  HVar7 = flip((HighsDomain *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),in_RDI);
  bVar1 = false;
  local_40 = 0;
  do {
    if (in_ECX <= local_40) {
      return bVar1;
    }
    if (((bVar1 == false) &&
        (local_30 = HVar7.column, *(int *)(in_RDX + (long)local_40 * 0x10 + 8) == local_30)) &&
       (HStack_2c = HVar7.boundtype,
       *(HighsBoundType *)(in_RDX + (long)local_40 * 0x10 + 0xc) == HStack_2c)) {
      local_38 = HVar7.boundval;
      if (*(int *)(in_RDX + (long)local_40 * 0x10 + 0xc) == 0) {
        if (local_38 < *(double *)(in_RDX + (long)local_40 * 0x10)) goto LAB_005d00ee;
        bVar1 = true;
      }
      else {
        if (*(double *)(in_RDX + (long)local_40 * 0x10) < local_38) goto LAB_005d00ee;
        bVar1 = true;
      }
    }
    else {
LAB_005d00ee:
      bVar2 = isActive(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (!bVar2) {
        col = (HighsInt)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        if (*(int *)(in_RDX + (long)local_40 * 0x10 + 0xc) == 0) {
          dVar6 = getColLowerPos(in_stack_ffffffffffffffa0,col,(HighsInt)in_stack_ffffffffffffff98,
                                 (HighsInt *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          if ((local_44 == -1) || (dVar6 < *(double *)(in_RDX + (long)local_40 * 0x10))) {
            return false;
          }
          while (pvVar3 = std::
                          vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                          operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                      *)((long)in_RDI->boundval + 0x78),(long)local_44),
                *(double *)(in_RDX + (long)local_40 * 0x10) <= pvVar3->first) {
            pvVar3 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                     operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                 *)((long)in_RDI->boundval + 0x78),(long)local_44);
            local_44 = pvVar3->second;
          }
        }
        else {
          dVar6 = getColUpperPos(in_stack_ffffffffffffffa0,col,(HighsInt)in_stack_ffffffffffffff98,
                                 (HighsInt *)
                                 CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          if ((local_44 == -1) ||
             (pdVar4 = (double *)(in_RDX + (long)local_40 * 0x10),
             *pdVar4 <= dVar6 && dVar6 != *pdVar4)) {
            return false;
          }
          while (pvVar3 = std::
                          vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                          operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                      *)((long)in_RDI->boundval + 0x78),(long)local_44),
                pvVar3->first <= *(double *)(in_RDX + (long)local_40 * 0x10)) {
            pvVar3 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                     operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                 *)((long)in_RDI->boundval + 0x78),(long)local_44);
            local_44 = pvVar3->second;
          }
        }
        this_00 = &in_RDI[8].column;
        in_stack_ffffffffffffff90 = local_44;
        pvVar5 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                           ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                            ((long)in_RDI->boundval + 0x48),(long)local_44);
        in_stack_ffffffffffffff98 = (HighsDomainChange *)pvVar5->boundval;
        in_stack_ffffffffffffffa0 = *(HighsDomain **)&pvVar5->column;
        std::
        vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
        ::push_back((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                     *)this_00,in_stack_ffffffffffffff78);
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool HighsDomain::ConflictSet::explainBoundChangeConflict(
    const LocalDomChg& locdomchg, const HighsDomainChange* conflict,
    HighsInt len) {
  resolvedDomainChanges.clear();
  auto domchg = localdom.flip(locdomchg.domchg);
  bool foundDomchg = false;
  for (HighsInt i = 0; i < len; ++i) {
    if (!foundDomchg && conflict[i].column == domchg.column &&
        conflict[i].boundtype == domchg.boundtype) {
      if (conflict[i].boundtype == HighsBoundType::kLower) {
        if (conflict[i].boundval <= domchg.boundval) {
          foundDomchg = true;
          continue;
        }
      } else {
        if (conflict[i].boundval >= domchg.boundval) {
          foundDomchg = true;
          continue;
        }
      }
    }
    if (globaldom.isActive(conflict[i])) continue;

    HighsInt pos;
    if (conflict[i].boundtype == HighsBoundType::kLower) {
      double lb =
          localdom.getColLowerPos(conflict[i].column, locdomchg.pos - 1, pos);

      if (pos == -1 || lb < conflict[i].boundval) return false;

      while (localdom.prevboundval_[pos].first >= conflict[i].boundval) {
        pos = localdom.prevboundval_[pos].second;
        // since we checked that the bound value is not active globally and is
        // active for the local domain at pos
        // pos should never become -1
        assert(pos != -1);
      }
    } else {
      double ub =
          localdom.getColUpperPos(conflict[i].column, locdomchg.pos - 1, pos);

      if (pos == -1 || ub > conflict[i].boundval) return false;

      while (localdom.prevboundval_[pos].first <= conflict[i].boundval) {
        pos = localdom.prevboundval_[pos].second;
        // since we checked that the bound value is not active globally and is
        // active for the local domain at pos
        // pos should never become -1
        assert(pos != -1);
      }
    }

    resolvedDomainChanges.push_back(
        LocalDomChg{pos, localdom.domchgstack_[pos]});
  }

  return foundDomchg;
}